

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_nim.cpp
# Opt level: O3

string * __thiscall
flatbuffers::anon_unknown_0::NimBfbsGenerator::Denamespace
          (string *__return_storage_ptr__,NimBfbsGenerator *this,string *s,string *importns,
          string *ns)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  string *psVar4;
  const_iterator cVar5;
  string *extraout_RAX;
  long *plVar6;
  size_type *psVar7;
  string *psVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(anonymous_namespace)::builtin_types_abi_cxx11_,s);
  if (cVar5._M_node != (_Base_ptr)((anonymous_namespace)::builtin_types_abi_cxx11_ + 8)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (s->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + s->_M_string_length);
    return extraout_RAX;
  }
  Namer::Denamespace(&local_70,&(this->namer_).super_Namer,s,ns,'.');
  (*(this->namer_).super_Namer._vptr_Namer[0x14])
            (__return_storage_ptr__,&this->namer_,&local_70,
             (ulong)(this->namer_).super_Namer.config_.types);
  paVar1 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  sVar3 = ns->_M_string_length;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  if (sVar3 == 0) {
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + __return_storage_ptr__->_M_string_length);
  }
  else {
    local_50[0] = local_40;
    pcVar2 = (ns->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)local_50,pcVar2,pcVar2 + sVar3);
    std::__cxx11::string::append((char *)local_50);
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_50,(ulong)(__return_storage_ptr__->_M_dataplus)._M_p);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_70.field_2._M_allocated_capacity = *psVar7;
      local_70.field_2._8_8_ = plVar6[3];
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar7;
      local_70._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_70._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
  }
  std::__cxx11::string::operator=((string *)importns,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((sVar3 != 0) && (local_50[0] != local_40)) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  psVar4 = (string *)importns->_M_string_length;
  if (psVar4 != (string *)0x0) {
    pcVar2 = (importns->_M_dataplus)._M_p;
    psVar8 = (string *)0x0;
    do {
      if (pcVar2[(long)&(psVar8->_M_dataplus)._M_p] == '.') {
        pcVar2[(long)&(psVar8->_M_dataplus)._M_p] = '_';
      }
      psVar8 = (string *)((long)&(psVar8->_M_dataplus)._M_p + 1);
    } while (psVar4 != psVar8);
  }
  return psVar4;
}

Assistant:

std::string Denamespace(const std::string &s, std::string &importns,
                          std::string &ns) const {
    if (builtin_types.find(s) != builtin_types.end()) { return s; }
    std::string type = namer_.Type(namer_.Denamespace(s, ns));
    importns = ns.empty() ? type : ns + "." + type;
    std::replace(importns.begin(), importns.end(), '.', '_');
    return type;
  }